

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O3

int __thiscall
FPNGTexture::CopyTrueColorPixels
          (FPNGTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  FWadLump *__return_storage_ptr__;
  _func_int **pp_Var4;
  uint uVar5;
  undefined4 in_register_00000084;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  PalEntry *pPVar9;
  BYTE *pBVar10;
  int iVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  DWORD len;
  DWORD id;
  FCopyInfo *local_458;
  FBitmap *local_450;
  undefined8 local_448;
  long local_440;
  PalEntry pe [256];
  
  local_448 = CONCAT44(in_register_00000084,rotate);
  uVar2 = (this->super_FTexture).Width;
  cVar1 = "\x01"[this->ColorType];
  iVar11 = (this->super_FTexture).SourceLump;
  local_450 = bmp;
  if (iVar11 < 0) {
    __return_storage_ptr__ = (FWadLump *)this->fr;
  }
  else {
    __return_storage_ptr__ = (FWadLump *)operator_new(0x38);
    FWadCollection::OpenLumpNum(__return_storage_ptr__,&Wads,iVar11);
  }
  local_440 = (long)cVar1 * (ulong)uVar2;
  lVar8 = 0;
  local_458 = inf;
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
            (__return_storage_ptr__,0x21,0);
  auVar13 = _DAT_005dc8a0;
  do {
    pe[lVar8].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)(auVar13._0_4_ * 0x10101 + (int)DAT_00619370);
    pe[lVar8 + 1].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)(auVar13._4_4_ * 0x10101 + DAT_00619370._4_4_);
    pe[lVar8 + 2].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         ((int)((auVar13._8_8_ & 0xffffffff) * 0x10101) + DAT_00619370._8_4_);
    pe[lVar8 + 3].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)(auVar13._12_4_ * 0x10101 + DAT_00619370._12_4_);
    lVar8 = lVar8 + 4;
    auVar14._0_4_ = auVar13._0_4_ + (int)DAT_005dc8f0;
    auVar14._4_4_ = auVar13._4_4_ + DAT_005dc8f0._4_4_;
    auVar14._8_4_ = auVar13._8_4_ + DAT_005dc8f0._8_4_;
    auVar14._12_4_ = auVar13._12_4_ + DAT_005dc8f0._12_4_;
    auVar13 = auVar14;
  } while (lVar8 != 0x100);
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (__return_storage_ptr__,&len,4);
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (__return_storage_ptr__,&id,4);
  iVar11 = 0;
  while ((lVar8 = local_440, id != 0x444e4549 && (id != 0x54414449))) {
    uVar5 = len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
    if (id == 0x534e5274) {
      if (this->ColorType != '\x03') goto LAB_004fea51;
      bVar12 = len != 0;
      len = uVar5;
      if (bVar12) {
        pBVar10 = &pe[0].field_0.field_0.a;
        uVar7 = 0;
        do {
          (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                    (__return_storage_ptr__,pBVar10,1);
          if ((*pBVar10 != '\0') && (*pBVar10 != 0xff)) {
            iVar11 = 1;
          }
          uVar7 = uVar7 + 1;
          pBVar10 = pBVar10 + 4;
        } while (uVar7 < len);
      }
    }
    else if (id == 0x45544c50) {
      len = uVar5;
      if (0 < this->PaletteSize) {
        pPVar9 = pe;
        lVar8 = 0;
        do {
          (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                    (__return_storage_ptr__,(undefined1 *)((long)&pPVar9->field_0 + 2),1);
          (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                    (__return_storage_ptr__,(undefined1 *)((long)&pPVar9->field_0 + 1),1);
          (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                    (__return_storage_ptr__,pPVar9,1);
          lVar8 = lVar8 + 1;
          pPVar9 = pPVar9 + 1;
        } while (lVar8 < this->PaletteSize);
      }
    }
    else {
LAB_004fea51:
      len = uVar5;
      (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
                (__return_storage_ptr__,(ulong)uVar5,1);
    }
    (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
              (__return_storage_ptr__,4,1);
    (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
              (__return_storage_ptr__,&len,4);
    id = 0x444e4549;
    (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
              (__return_storage_ptr__,&id,4);
  }
  if (((this->ColorType == '\0') && (this->HaveTrans == true)) &&
     ((ulong)this->NonPaletteTrans[0] < 0x100)) {
    pe[this->NonPaletteTrans[0]].field_0.field_0.a = '\0';
    iVar11 = 1;
  }
  pBVar10 = (BYTE *)operator_new__(local_440 * (ulong)(this->super_FTexture).Height);
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
            (__return_storage_ptr__,(ulong)this->StartOfIDAT,0);
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (__return_storage_ptr__,&len,4);
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (__return_storage_ptr__,&id,4);
  M_ReadIDAT(&__return_storage_ptr__->super_FileReader,pBVar10,(uint)(this->super_FTexture).Width,
             (uint)(this->super_FTexture).Height,(int)lVar8,this->BitDepth,this->ColorType,
             this->Interlace,len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18
            );
  if (__return_storage_ptr__ != (FWadLump *)this->fr) {
    (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])
              (__return_storage_ptr__);
  }
  switch(this->ColorType) {
  case '\0':
  case '\x03':
    uVar7 = (ulong)(this->super_FTexture).Width;
    (*local_450->_vptr_FBitmap[3])
              (local_450,(ulong)(uint)x,(ulong)(uint)y,pBVar10,uVar7,
               (ulong)(this->super_FTexture).Height,1,uVar7,local_448,pe,local_458);
    break;
  case '\x02':
    uVar7 = (ulong)(this->super_FTexture).Width;
    uVar6 = (ulong)(this->super_FTexture).Height;
    if (this->HaveTrans == false) {
      (*local_450->_vptr_FBitmap[2])
                (local_450,(ulong)(uint)x,(ulong)(uint)y,pBVar10,uVar7,uVar6,3,lVar8,local_448,0,
                 local_458,0,0,0);
    }
    else {
      (*local_450->_vptr_FBitmap[2])
                (local_450,(ulong)(uint)x,(ulong)(uint)y,pBVar10,uVar7,uVar6,3,lVar8,local_448,1,
                 local_458,(ulong)this->NonPaletteTrans[0],(ulong)this->NonPaletteTrans[1],
                 (ulong)this->NonPaletteTrans[2]);
      iVar11 = 1;
    }
    break;
  case '\x04':
    uVar2 = (this->super_FTexture).Width;
    uVar3 = (this->super_FTexture).Height;
    pp_Var4 = local_450->_vptr_FBitmap;
    uVar16 = 3;
    uVar15 = 2;
    goto LAB_004fec8e;
  case '\x06':
    uVar2 = (this->super_FTexture).Width;
    uVar3 = (this->super_FTexture).Height;
    pp_Var4 = local_450->_vptr_FBitmap;
    uVar16 = 2;
    uVar15 = 4;
LAB_004fec8e:
    (*pp_Var4[2])(local_450,(ulong)(uint)x,(ulong)(uint)y,pBVar10,(ulong)uVar2,(ulong)uVar3,uVar15,
                  lVar8,local_448,uVar16,local_458,0,0,0);
    iVar11 = -1;
  }
  operator_delete__(pBVar10);
  return iVar11;
}

Assistant:

int FPNGTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	// Parse pre-IDAT chunks. I skip the CRCs. Is that bad?
	PalEntry pe[256];
	DWORD len, id;
	FileReader *lump;
	static char bpp[] = {1, 0, 3, 1, 2, 0, 4};
	int pixwidth = Width * bpp[ColorType];
	int transpal = false;

	if (SourceLump >= 0)
	{
		lump = new FWadLump(Wads.OpenLumpNum(SourceLump));
	}
	else
	{
		lump = fr;// new FileReader(SourceFile.GetChars());
	}

	lump->Seek(33, SEEK_SET);
	for(int i = 0; i < 256; i++)	// default to a gray map
		pe[i] = PalEntry(255,i,i,i);

	lump->Read(&len, 4);
	lump->Read(&id, 4);
	while (id != MAKE_ID('I','D','A','T') && id != MAKE_ID('I','E','N','D'))
	{
		len = BigLong((unsigned int)len);
		switch (id)
		{
		default:
			lump->Seek (len, SEEK_CUR);
			break;

		case MAKE_ID('P','L','T','E'):
			for(int i = 0; i < PaletteSize; i++)
			{
				(*lump) >> pe[i].r >> pe[i].g >> pe[i].b;
			}
			break;

		case MAKE_ID('t','R','N','S'):
			if (ColorType == 3)
			{
				for(DWORD i = 0; i < len; i++)
				{
					(*lump) >> pe[i].a;
					if (pe[i].a != 0 && pe[i].a != 255)
						transpal = true;
				}
			}
			else
			{
				lump->Seek(len, SEEK_CUR);
			}
			break;
		}
		lump->Seek(4, SEEK_CUR);		// Skip CRC
		lump->Read(&len, 4);
		id = MAKE_ID('I','E','N','D');
		lump->Read(&id, 4);
	}

	if (ColorType == 0 && HaveTrans && NonPaletteTrans[0] < 256)
	{
		pe[NonPaletteTrans[0]].a = 0;
		transpal = true;
	}

	BYTE * Pixels = new BYTE[pixwidth * Height];

	lump->Seek (StartOfIDAT, SEEK_SET);
	lump->Read(&len, 4);
	lump->Read(&id, 4);
	M_ReadIDAT (lump, Pixels, Width, Height, pixwidth, BitDepth, ColorType, Interlace, BigLong((unsigned int)len));
	if (lump != fr) delete lump;

	switch (ColorType)
	{
	case 0:
	case 3:
		bmp->CopyPixelData(x, y, Pixels, Width, Height, 1, Width, rotate, pe, inf);
		break;

	case 2:
		if (!HaveTrans)
		{
			bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 3, pixwidth, rotate, CF_RGB, inf);
		}
		else
		{
			bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 3, pixwidth, rotate, CF_RGBT, inf,
				NonPaletteTrans[0], NonPaletteTrans[1], NonPaletteTrans[2]);
			transpal = true;
		}
		break;

	case 4:
		bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 2, pixwidth, rotate, CF_IA, inf);
		transpal = -1;
		break;

	case 6:
		bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 4, pixwidth, rotate, CF_RGBA, inf);
		transpal = -1;
		break;

	default:
		break;

	}
	delete[] Pixels;
	return transpal;
}